

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O0

int __thiscall NetOptimize::fuse_binaryop_eltwise(NetOptimize *this)

{
  value_type vVar1;
  long lVar2;
  int *piVar3;
  Layer *pLVar4;
  bool bVar5;
  reference ppLVar6;
  size_type sVar7;
  reference pvVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  bool *pbVar12;
  long in_RDI;
  ParamDict pd;
  Eltwise *eltwise;
  BinaryOp *binaryop1;
  BinaryOp *binaryop0;
  size_t j1;
  size_t j0;
  int bottom_blob_index_1;
  int bottom_blob_index_0;
  BinaryOp *binaryop;
  size_t i;
  size_t layer_count;
  Layer *in_stack_fffffffffffffd78;
  value_type in_stack_fffffffffffffd80;
  value_type in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd8c;
  undefined4 *in_stack_fffffffffffffd90;
  undefined4 *in_stack_fffffffffffffd98;
  Mat *in_stack_fffffffffffffda0;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe18;
  FILE *__stream;
  vector<int,_std::allocator<int>_> local_1b0;
  undefined4 local_198;
  long *local_190;
  undefined4 local_188;
  undefined4 local_184;
  undefined4 local_180;
  undefined4 local_17c;
  undefined4 local_178;
  undefined8 local_170;
  undefined1 local_158 [16];
  Layer *local_148;
  value_type local_140;
  value_type local_138;
  size_type local_130;
  size_type local_128;
  value_type local_120;
  value_type local_11c;
  value_type local_118;
  size_type local_110;
  ulong local_108;
  vector<int,_std::allocator<int>_> *local_f8;
  int local_e8;
  undefined4 local_e4;
  vector<int,_std::allocator<int>_> *local_e0;
  bool *local_d8;
  bool *local_d0;
  undefined8 local_c8;
  bool *local_c0;
  undefined8 local_b8;
  bool *local_b0;
  undefined8 local_a8;
  bool *local_a0;
  undefined8 local_98;
  bool *local_90;
  undefined8 local_88;
  bool *local_80;
  undefined8 local_78;
  bool *local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined4 local_54;
  vector<int,_std::allocator<int>_> *local_50;
  int local_48;
  undefined4 local_44;
  bool *local_40;
  int local_28;
  undefined4 local_24;
  vector<int,_std::allocator<int>_> *local_20;
  pointer local_18;
  void *local_8;
  
  local_108 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                        (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58))
  ;
  local_110 = 0;
  do {
    if (local_108 <= local_110) {
      return 0;
    }
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),local_110)
    ;
    bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78);
    if (!bVar5) {
      ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                            (in_RDI + 0x58),local_110);
      sVar7 = std::vector<int,_std::allocator<int>_>::size(&(*ppLVar6)->bottoms);
      if (sVar7 == 2) {
        ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                              (in_RDI + 0x58),local_110);
        local_118 = *ppLVar6;
        if ((*(int *)&local_118[1]._vptr_Layer == 0) &&
           (*(int *)((long)&local_118[1]._vptr_Layer + 4) == 0)) {
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_118->bottoms,0);
          local_11c = *pvVar8;
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_118->bottoms,1);
          local_120 = *pvVar8;
          for (local_128 = 0; local_128 < local_110; local_128 = local_128 + 1) {
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                       local_128);
            bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78);
            if (!bVar5) {
              ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                  (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                    (in_RDI + 0x58),local_128);
              sVar7 = std::vector<int,_std::allocator<int>_>::size(&(*ppLVar6)->bottoms);
              if ((sVar7 == 1) &&
                 (ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                      (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                        (in_RDI + 0x58),local_128),
                 *(int *)&(*ppLVar6)[1]._vptr_Layer == 2)) {
                ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                    (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                      (in_RDI + 0x58),local_128);
                pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar6)->tops,0);
                if (*pvVar8 == local_11c) break;
              }
            }
          }
          for (local_130 = 0; local_130 < local_110; local_130 = local_130 + 1) {
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                       local_130);
            bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78);
            if (!bVar5) {
              ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                  (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                    (in_RDI + 0x58),local_130);
              sVar7 = std::vector<int,_std::allocator<int>_>::size(&(*ppLVar6)->bottoms);
              if ((sVar7 == 1) &&
                 (ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                      (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                        (in_RDI + 0x58),local_130),
                 *(int *)&(*ppLVar6)[1]._vptr_Layer == 2)) {
                ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                    (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                      (in_RDI + 0x58),local_130);
                pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar6)->tops,0);
                if (*pvVar8 == local_120) break;
              }
            }
          }
          if ((local_128 != local_110) || (local_130 != local_110)) {
            ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                  (in_RDI + 0x58),local_128);
            local_138 = *ppLVar6;
            ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                  (in_RDI + 0x58),local_130);
            local_140 = *ppLVar6;
            __stream = _stderr;
            uVar9 = std::__cxx11::string::c_str();
            uVar10 = std::__cxx11::string::c_str();
            uVar11 = std::__cxx11::string::c_str();
            fprintf(__stream,"fuse_binaryop_eltwise %s %s %s\n",uVar9,uVar10,uVar11);
            local_148 = ncnn::create_layer((char *)in_stack_fffffffffffffd78);
            std::__cxx11::string::operator=((string *)&local_148->type,"Eltwise");
            std::__cxx11::string::operator=((string *)&local_148->name,(string *)&local_118->name);
            std::vector<int,_std::allocator<int>_>::operator=
                      ((vector<int,_std::allocator<int>_> *)__stream,in_stack_fffffffffffffe18);
            std::vector<int,_std::allocator<int>_>::operator=
                      ((vector<int,_std::allocator<int>_> *)__stream,in_stack_fffffffffffffe18);
            ncnn::ParamDict::ParamDict((ParamDict *)in_stack_fffffffffffffda0);
            (*local_148->_vptr_Layer[2])(local_148,local_158);
            *(undefined4 *)&local_148[1]._vptr_Layer = 1;
            in_stack_fffffffffffffe18 = &local_1b0;
            local_54 = 2;
            local_60 = 4;
            local_68 = 0;
            local_1b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)0x0;
            local_1b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = (int *)0x0;
            local_1b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (pointer)0x0;
            local_198 = 0;
            local_190 = (long *)0x0;
            local_188 = 0;
            local_184 = 0;
            local_180 = 0;
            local_17c = 0;
            local_178 = 0;
            local_170 = 0;
            local_50 = in_stack_fffffffffffffe18;
            ncnn::Mat::create(in_stack_fffffffffffffda0,
                              (int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
                              (size_t)in_stack_fffffffffffffd90,
                              (Allocator *)
                              CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
            pLVar4 = local_148;
            pbVar12 = &local_148[1].one_blob_only;
            local_e0 = &local_1b0;
            local_d8 = pbVar12;
            if ((vector<int,_std::allocator<int>_> *)pbVar12 != local_e0) {
              if (local_1b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish != (int *)0x0) {
                local_e4 = 1;
                LOCK();
                local_e8 = *local_1b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish;
                *local_1b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish =
                     *local_1b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
                UNLOCK();
              }
              lVar2._0_1_ = local_148[1].support_tensor_storage;
              lVar2._1_1_ = local_148[1].support_reserved_00;
              lVar2._2_1_ = local_148[1].support_reserved_0;
              lVar2._3_1_ = local_148[1].support_reserved_1;
              lVar2._4_1_ = local_148[1].support_reserved_2;
              lVar2._5_1_ = local_148[1].support_reserved_3;
              lVar2._6_1_ = local_148[1].support_reserved_4;
              lVar2._7_1_ = local_148[1].support_reserved_5;
              local_40 = pbVar12;
              if (lVar2 != 0) {
                piVar3 = *(int **)&local_148[1].support_tensor_storage;
                local_44 = 0xffffffff;
                LOCK();
                local_48 = *piVar3;
                *piVar3 = *piVar3 + -1;
                UNLOCK();
                if (local_48 == 1) {
                  if (*(long *)&local_148[1].typeindex == 0) {
                    local_8 = *(void **)pbVar12;
                    if (local_8 != (void *)0x0) {
                      free(local_8);
                    }
                  }
                  else {
                    uVar9._0_1_ = local_148[1].one_blob_only;
                    uVar9._1_1_ = local_148[1].support_inplace;
                    uVar9._2_1_ = local_148[1].support_vulkan;
                    uVar9._3_1_ = local_148[1].support_packing;
                    uVar9._4_1_ = local_148[1].support_bf16_storage;
                    uVar9._5_1_ = local_148[1].support_fp16_storage;
                    uVar9._6_1_ = local_148[1].support_int8_storage;
                    uVar9._7_1_ = local_148[1].support_image_storage;
                    (**(code **)(**(long **)&local_148[1].typeindex + 0x18))
                              (*(long **)&local_148[1].typeindex,uVar9);
                  }
                }
              }
              pLVar4[1].one_blob_only = false;
              pLVar4[1].support_inplace = false;
              pLVar4[1].support_vulkan = false;
              pLVar4[1].support_packing = false;
              pLVar4[1].support_bf16_storage = false;
              pLVar4[1].support_fp16_storage = false;
              pLVar4[1].support_int8_storage = false;
              pLVar4[1].support_image_storage = false;
              pLVar4[1].support_reserved_6 = false;
              pLVar4[1].support_reserved_7 = false;
              pLVar4[1].support_reserved_8 = false;
              pLVar4[1].support_reserved_9 = false;
              pLVar4[1].support_reserved_10 = false;
              pLVar4[1].support_reserved_11 = false;
              pLVar4[1].support_reserved_12 = false;
              pLVar4[1].support_reserved_13 = false;
              *(undefined4 *)&pLVar4[1].userdata = 0;
              *(undefined4 *)&pLVar4[1].type = 0;
              *(undefined4 *)&pLVar4[1].type.field_0x4 = 0;
              *(undefined4 *)&pLVar4[1].type._M_string_length = 0;
              *(undefined4 *)((long)&pLVar4[1].type._M_string_length + 4) = 0;
              *(undefined4 *)&pLVar4[1].type.field_2 = 0;
              *(undefined8 *)((long)&pLVar4[1].type.field_2 + 8) = 0;
              pLVar4[1].support_tensor_storage = false;
              pLVar4[1].support_reserved_00 = false;
              pLVar4[1].support_reserved_0 = false;
              pLVar4[1].support_reserved_1 = false;
              pLVar4[1].support_reserved_2 = false;
              pLVar4[1].support_reserved_3 = false;
              pLVar4[1].support_reserved_4 = false;
              pLVar4[1].support_reserved_5 = false;
              *(pointer *)pbVar12 =
                   (local_e0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
              *(pointer *)&pLVar4[1].support_tensor_storage =
                   (local_e0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
              *(pointer *)&pLVar4[1].support_reserved_6 =
                   (local_e0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
              *(undefined4 *)&pLVar4[1].userdata =
                   *(undefined4 *)
                    &local_e0[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
              *(pointer *)&pLVar4[1].typeindex =
                   local_e0[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              *(undefined4 *)&pLVar4[1].type =
                   *(undefined4 *)
                    &local_e0[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
              *(undefined4 *)&pLVar4[1].type.field_0x4 =
                   *(undefined4 *)
                    ((long)&local_e0[1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 4);
              *(undefined4 *)&pLVar4[1].type._M_string_length =
                   *(undefined4 *)
                    &local_e0[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
              *(undefined4 *)((long)&pLVar4[1].type._M_string_length + 4) =
                   *(undefined4 *)
                    ((long)&local_e0[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + 4);
              *(undefined4 *)&pLVar4[1].type.field_2 =
                   *(undefined4 *)
                    &local_e0[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
              *(pointer *)((long)&pLVar4[1].type.field_2 + 8) =
                   local_e0[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
            }
            local_f8 = &local_1b0;
            local_d0 = pbVar12;
            local_20 = local_f8;
            if (local_1b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish != (int *)0x0) {
              local_24 = 0xffffffff;
              LOCK();
              local_28 = *local_1b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              *local_1b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish =
                   *local_1b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + -1;
              UNLOCK();
              if (local_28 == 1) {
                if (local_190 == (long *)0x0) {
                  local_18 = local_1b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start;
                  if (local_1b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    free(local_1b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start);
                  }
                }
                else {
                  (**(code **)(*local_190 + 0x18))
                            (local_190,
                             local_1b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start);
                }
              }
            }
            local_1b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)0x0;
            local_1b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (pointer)0x0;
            local_198 = 0;
            local_188 = 0;
            local_184 = 0;
            local_180 = 0;
            local_17c = 0;
            local_178 = 0;
            local_170 = 0;
            local_1b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)0x0;
            if ((local_128 != local_110) && (local_130 != local_110)) {
              local_70 = &local_148[1].one_blob_only;
              local_78 = 0;
              **(undefined4 **)local_70 = *(undefined4 *)&local_138[1].one_blob_only;
              local_80 = &local_148[1].one_blob_only;
              local_88 = 1;
              *(undefined4 *)(*(long *)local_80 + 4) = *(undefined4 *)&local_140[1].one_blob_only;
              pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_138->bottoms,0);
              vVar1 = *pvVar8;
              pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_148->bottoms,0);
              *pvVar8 = vVar1;
              pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_140->bottoms,0);
              vVar1 = *pvVar8;
              pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_148->bottoms,1);
              *pvVar8 = vVar1;
              std::__cxx11::string::operator=((string *)&local_138->type,"ncnnfused");
              std::__cxx11::string::operator=((string *)&local_140->type,"ncnnfused");
            }
            if ((local_128 != local_110) && (local_130 == local_110)) {
              local_90 = &local_148[1].one_blob_only;
              local_98 = 0;
              **(undefined4 **)local_90 = *(undefined4 *)&local_138[1].one_blob_only;
              local_a0 = &local_148[1].one_blob_only;
              local_a8 = 1;
              *(undefined4 *)(*(long *)local_a0 + 4) = 0x3f800000;
              in_stack_fffffffffffffda0 = (Mat *)0x0;
              pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_138->bottoms,0);
              vVar1 = *pvVar8;
              pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (&local_148->bottoms,(size_type)in_stack_fffffffffffffda0);
              *pvVar8 = vVar1;
              std::__cxx11::string::operator=((string *)&local_138->type,"ncnnfused");
            }
            if ((local_128 == local_110) && (local_130 != local_110)) {
              local_b0 = &local_148[1].one_blob_only;
              local_b8 = 0;
              in_stack_fffffffffffffd98 = *(undefined4 **)local_b0;
              *in_stack_fffffffffffffd98 = 0x3f800000;
              in_stack_fffffffffffffd8c._0_1_ = local_140[1].one_blob_only;
              in_stack_fffffffffffffd8c._1_1_ = local_140[1].support_inplace;
              in_stack_fffffffffffffd8c._2_1_ = local_140[1].support_vulkan;
              in_stack_fffffffffffffd8c._3_1_ = local_140[1].support_packing;
              local_c0 = &local_148[1].one_blob_only;
              local_c8 = 1;
              in_stack_fffffffffffffd90 = (undefined4 *)(*(long *)local_c0 + 4);
              *in_stack_fffffffffffffd90 = in_stack_fffffffffffffd8c;
              pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_140->bottoms,0);
              in_stack_fffffffffffffd88 = *pvVar8;
              pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_148->bottoms,1);
              *pvVar8 = in_stack_fffffffffffffd88;
              std::__cxx11::string::operator=((string *)&local_140->type,"ncnnfused");
            }
            in_stack_fffffffffffffd78 = local_148;
            ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                  (in_RDI + 0x58),local_110);
            *ppLVar6 = in_stack_fffffffffffffd78;
            in_stack_fffffffffffffd80 = local_118;
            if (local_118 != (value_type)0x0) {
              (*local_118->_vptr_Layer[1])();
            }
            ncnn::ParamDict::~ParamDict((ParamDict *)in_stack_fffffffffffffd80);
          }
        }
      }
    }
    local_110 = local_110 + 1;
  } while( true );
}

Assistant:

int NetOptimize::fuse_binaryop_eltwise()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "BinaryOp")
            continue;

        if (layers[i]->bottoms.size() != 2)
            continue;

        ncnn::BinaryOp* binaryop = (ncnn::BinaryOp*)layers[i];

        if (binaryop->op_type != ncnn::BinaryOp::Operation_ADD)
            continue;

        if (binaryop->with_scalar)
            continue;

        // BinaryOp - BinaryOp - BinaryOp
        int bottom_blob_index_0 = binaryop->bottoms[0];
        int bottom_blob_index_1 = binaryop->bottoms[1];

        size_t j0 = 0;
        for (; j0 < i; j0++)
        {
            if (layers[j0]->type != "BinaryOp")
                continue;

            if (layers[j0]->bottoms.size() != 1)
                continue;

            if (((ncnn::BinaryOp*)layers[j0])->op_type != ncnn::BinaryOp::Operation_MUL)
                continue;

            if (layers[j0]->tops[0] == bottom_blob_index_0)
                break;
        }

        size_t j1 = 0;
        for (; j1 < i; j1++)
        {
            if (layers[j1]->type != "BinaryOp")
                continue;

            if (layers[j1]->bottoms.size() != 1)
                continue;

            if (((ncnn::BinaryOp*)layers[j1])->op_type != ncnn::BinaryOp::Operation_MUL)
                continue;

            if (layers[j1]->tops[0] == bottom_blob_index_1)
                break;
        }

        if (j0 == i && j1 == i)
            continue;

        ncnn::BinaryOp* binaryop0 = (ncnn::BinaryOp*)layers[j0];
        ncnn::BinaryOp* binaryop1 = (ncnn::BinaryOp*)layers[j1];

        fprintf(stderr, "fuse_binaryop_eltwise %s %s %s\n", binaryop0->name.c_str(), binaryop1->name.c_str(), binaryop->name.c_str());

        ncnn::Eltwise* eltwise = (ncnn::Eltwise*)ncnn::create_layer("Eltwise");

        eltwise->type = "Eltwise";
        eltwise->name = binaryop->name;
        eltwise->bottoms = binaryop->bottoms;
        eltwise->tops = binaryop->tops;

        ncnn::ParamDict pd;
        eltwise->load_param(pd);

        eltwise->op_type = ncnn::Eltwise::Operation_SUM;

        eltwise->coeffs = ncnn::Mat(2);

        if (j0 != i && j1 != i)
        {
            // fuse BinaryOp - BinaryOp - BinaryOp to Eltwise
            eltwise->coeffs[0] = binaryop0->b;
            eltwise->coeffs[1] = binaryop1->b;

            eltwise->bottoms[0] = binaryop0->bottoms[0];
            eltwise->bottoms[1] = binaryop1->bottoms[0];

            binaryop0->type = "ncnnfused";
            binaryop1->type = "ncnnfused";
        }
        if (j0 != i && j1 == i)
        {
            // fuse BinaryOp - X - BinaryOp to Eltwise
            eltwise->coeffs[0] = binaryop0->b;
            eltwise->coeffs[1] = 1.f;

            eltwise->bottoms[0] = binaryop0->bottoms[0];

            binaryop0->type = "ncnnfused";
        }
        if (j0 == i && j1 != i)
        {
            // fuse X - BinaryOp - BinaryOp to Eltwise
            eltwise->coeffs[0] = 1.f;
            eltwise->coeffs[1] = binaryop1->b;

            eltwise->bottoms[1] = binaryop1->bottoms[0];

            binaryop1->type = "ncnnfused";
        }

        layers[i] = eltwise;
        delete binaryop;
    }

    return 0;
}